

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  Nullable<const_char_*> failure_msg;
  TestParsingMergeLite_RepeatedFieldsGenerator *_this;
  TestParsingMergeLite_RepeatedFieldsGenerator *local_20;
  LogMessageFatal local_18;
  
  local_20 = (TestParsingMergeLite_RepeatedFieldsGenerator *)to_msg;
  local_18.super_LogMessage._0_8_ = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_const*,proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator*>
                          ((TestParsingMergeLite_RepeatedFieldsGenerator **)&local_18,&local_20,
                           "&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::MergeFrom
              (&(local_20->field_0)._impl_.field1_,
               (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)(from_msg + 1));
    google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::MergeFrom
              (&(local_20->field_0)._impl_.field2_,
               (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)
               &from_msg[2]._internal_metadata_);
    google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::MergeFrom
              (&(local_20->field_0)._impl_.field3_,
               (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)(from_msg + 4));
    google::protobuf::
    RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1>::
    MergeFrom(&(local_20->field_0)._impl_.group1_,
              (RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1>
               *)&from_msg[5]._internal_metadata_);
    google::protobuf::
    RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2>::
    MergeFrom(&(local_20->field_0)._impl_.group2_,
              (RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2>
               *)(from_msg + 7));
    google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::MergeFrom
              (&(local_20->field_0)._impl_.ext1_,
               (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)
               &from_msg[8]._internal_metadata_);
    google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::MergeFrom
              (&(local_20->field_0)._impl_.ext2_,
               (RepeatedPtrField<proto2_unittest::TestAllTypesLite> *)(from_msg + 10));
    google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
              (&(local_20->super_MessageLite)._internal_metadata_,&from_msg->_internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_lite.pb.cc"
             ,0x1ef4,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_18);
}

Assistant:

void TestParsingMergeLite_RepeatedFieldsGenerator::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestParsingMergeLite_RepeatedFieldsGenerator*>(&to_msg);
  auto& from = static_cast<const TestParsingMergeLite_RepeatedFieldsGenerator&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_field1()->MergeFrom(
      from._internal_field1());
  _this->_internal_mutable_field2()->MergeFrom(
      from._internal_field2());
  _this->_internal_mutable_field3()->MergeFrom(
      from._internal_field3());
  _this->_internal_mutable_group1()->MergeFrom(
      from._internal_group1());
  _this->_internal_mutable_group2()->MergeFrom(
      from._internal_group2());
  _this->_internal_mutable_ext1()->MergeFrom(
      from._internal_ext1());
  _this->_internal_mutable_ext2()->MergeFrom(
      from._internal_ext2());
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}